

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O3

void __thiscall
QPlainTestLogger::addBenchmarkResults(QPlainTestLogger *this,QList<QBenchmarkResult> *results)

{
  int iVar1;
  
  iVar1 = QTestLog::verboseLevel();
  if ((-1 < iVar1) && ((results->d).size != 0)) {
    printBenchmarkResultsHeader(this,(results->d).ptr);
    printBenchmarkResults(this,results);
    return;
  }
  return;
}

Assistant:

void QPlainTestLogger::addBenchmarkResults(const QList<QBenchmarkResult> &results)
{
    // suppress benchmark results in silent mode
    if (QTestLog::verboseLevel() < 0 || results.isEmpty())
        return;

    printBenchmarkResultsHeader(results.first());
    printBenchmarkResults(results);
}